

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O2

void * argtable3_xrealloc(void *ptr,size_t size)

{
  void *pvVar1;
  
  pvVar1 = realloc(ptr,size + (size == 0));
  if (pvVar1 == (void *)0x0) {
    (*s_panic)("Out of memory!\n");
  }
  return pvVar1;
}

Assistant:

void* xrealloc(void* ptr, size_t size) {
    size_t allocated_size = size ? size : 1;
    void* ret = realloc(ptr, allocated_size);
    if (!ret) {
        s_panic("Out of memory!\n");
    }
    return ret;
}